

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncEvent.cpp
# Opt level: O1

void __thiscall cali::TimedAsyncEvent::end(TimedAsyncEvent *this)

{
  long lVar1;
  int iVar2;
  long lVar3;
  undefined4 extraout_var;
  SnapshotView info;
  size_type __dnew;
  Caliper c;
  undefined1 local_88 [24];
  Node *local_70;
  undefined8 local_68;
  long local_60;
  uint64_t local_58;
  Caliper local_50;
  
  lVar3 = std::chrono::_V2::steady_clock::now();
  lVar1 = (this->start_time_).__d.__r;
  Caliper::Caliper(&local_50);
  if (_ZZN12_GLOBAL__N_123get_event_duration_attrERN4cali7CaliperEE11s_attr_node_0 == (Node *)0x0) {
    local_58 = 0x11;
    local_88._0_8_ = (Node *)(local_88 + 0x10);
    local_88._0_8_ = std::__cxx11::string::_M_create((ulong *)local_88,(ulong)&local_58);
    local_88._16_8_ = local_58;
    *(undefined4 *)&(((Node *)local_88._0_8_)->super_LockfreeIntrusiveTree<cali::Node>).m_me =
         0x6e657665;
    builtin_strncpy((char *)((long)&(((Node *)local_88._0_8_)->
                                    super_LockfreeIntrusiveTree<cali::Node>).m_me + 4),"t.du",4);
    *(undefined4 *)&(((Node *)local_88._0_8_)->super_LockfreeIntrusiveTree<cali::Node>).m_node =
         0x69746172;
    builtin_strncpy((char *)((long)&(((Node *)local_88._0_8_)->
                                    super_LockfreeIntrusiveTree<cali::Node>).m_node + 4),"on.n",4);
    *(undefined1 *)&((Node *)local_88._0_8_)->m_id = 0x73;
    local_88._8_8_ = local_58;
    *(undefined1 *)
     ((long)&(((Node *)local_88._0_8_)->super_LockfreeIntrusiveTree<cali::Node>).m_me + local_58) =
         0;
    iVar2 = (*local_50.super_CaliperMetadataAccessInterface._vptr_CaliperMetadataAccessInterface[4])
                      (&local_50,local_88,3,0x841,0,0,0);
    local_70 = (Node *)CONCAT44(extraout_var,iVar2);
    if ((Node *)local_88._0_8_ != (Node *)(local_88 + 0x10)) {
      operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
    }
    LOCK();
    UNLOCK();
    _ZZN12_GLOBAL__N_123get_event_duration_attrERN4cali7CaliperEE11s_attr_node_0 = local_70;
  }
  else {
    local_70 = (Node *)Attribute::make_attribute
                                 (
                                 _ZZN12_GLOBAL__N_123get_event_duration_attrERN4cali7CaliperEE11s_attr_node_0
                                 );
  }
  local_60 = lVar3 - lVar1;
  local_88._0_8_ = this->end_tree_node_;
  local_88._8_8_ = (((Node *)local_88._0_8_)->m_data).m_v.type_and_size;
  local_88._16_8_ = (((Node *)local_88._0_8_)->m_data).m_v.value;
  local_68 = 3;
  info.m_len = 2;
  info.m_data = (Entry *)local_88;
  Caliper::async_event(&local_50,info);
  return;
}

Assistant:

void TimedAsyncEvent::end()
{
    uint64_t nsec = std::chrono::duration_cast<std::chrono::nanoseconds>(clock::now() - start_time_).count();

    Caliper c;
    Attribute duration_attr = ::get_event_duration_attr(c);
    const Entry data[2] = {
        { end_tree_node_ }, { duration_attr, cali_make_variant_from_uint(nsec) }
    };

    c.async_event(SnapshotView(2, data));
}